

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatin1stringmatcher.h
# Opt level: O3

R_conflict10 __thiscall
QtPrivate::
q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
::operator()(q_boyer_moore_searcher_hashed_needle<char_const*,QtPrivate::QCaseInsensitiveLatin1Hash,std::equal_to<void>>
             *this,char *first,char *last,char *pat_first,char *pat_last)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  R_conflict10 RVar6;
  R_conflict10 RVar7;
  R_conflict10 RVar8;
  
  uVar3 = (long)pat_last - (long)pat_first;
  if (uVar3 == 0) {
    RVar6.end = first;
    RVar6.begin = first;
    return RVar6;
  }
  pbVar1 = (byte *)(first + (uVar3 - 1));
  if (last <= pbVar1) {
    RVar7.end = last;
    RVar7.begin = last;
    return RVar7;
  }
  lVar4 = (long)pat_first - (long)pat_last;
  do {
    uVar5 = (ulong)(byte)this[""[*pbVar1]];
    if (uVar5 == 0) {
      pbVar2 = pbVar1;
      uVar5 = uVar3;
      if ((long)uVar3 < 1) {
        lVar4 = 0;
LAB_001752d8:
        last = (char *)(pbVar1 + lVar4 + 1);
        pbVar2 = pbVar1 + uVar3 + lVar4 + 1;
        break;
      }
      while (""[*pbVar2] == pat_first[uVar5 - 1]) {
        uVar5 = uVar5 - 1;
        pbVar2 = pbVar2 + -1;
        if (uVar5 == 0) goto LAB_001752d8;
      }
      if (uVar3 != (byte)this[""[*pbVar2]]) {
        uVar5 = 1;
      }
    }
    pbVar1 = pbVar1 + uVar5;
    pbVar2 = (byte *)last;
  } while (pbVar1 < last);
  RVar8.end = (char *)pbVar2;
  RVar8.begin = last;
  return RVar8;
}

Assistant:

constexpr auto operator()(RandomIt2 first, RandomIt2 last, RandomIt1 pat_first,
                              RandomIt1 pat_last) const
    {
        struct R
        {
            RandomIt2 begin, end;
        };
        Hash hf;
        BinaryPredicate pred;
        auto pat_length = std::distance(pat_first, pat_last);
        if (pat_length == 0)
            return R{ first, first };

        const qsizetype pl_minus_one = qsizetype(pat_length - 1);
        RandomIt2 current = first + pl_minus_one;

        while (current < last) {
            qsizetype skip = m_skiptable[hf(*current)];
            if (!skip) {
                // possible match
                while (skip < pat_length) {
                    if (!pred(hf(*(current - skip)), uchar(pat_first[pl_minus_one - skip])))
                        break;
                    skip++;
                }
                if (skip > pl_minus_one) { // we have a match
                    auto match = current - skip + 1;
                    return R{ match, match + pat_length };
                }

                // If we don't have a match we are a bit inefficient as we only skip by one
                // when we have the non matching char in the string.
                if (m_skiptable[hf(*(current - skip))] == pat_length)
                    skip = pat_length - skip;
                else
                    skip = 1;
            }
            current += skip;
        }

        return R{ last, last };
    }